

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void riscv_translate_init_riscv32(uc_struct_conflict12 *uc)

{
  TCGContext_conflict9 *tcg_ctx_00;
  TCGv_i32 pTVar1;
  TCGv_i64 pTVar2;
  TCGContext_conflict9 *tcg_ctx;
  int i;
  uc_struct_conflict12 *uc_local;
  
  tcg_ctx_00 = uc->tcg_ctx;
  tcg_ctx_00->cpu_gpr[0] = (TCGv_i32)0x0;
  for (tcg_ctx._4_4_ = 1; tcg_ctx._4_4_ < 0x20; tcg_ctx._4_4_ = tcg_ctx._4_4_ + 1) {
    pTVar1 = tcg_global_mem_new_i32
                       (tcg_ctx_00,tcg_ctx_00->cpu_env,(long)tcg_ctx._4_4_ << 2,
                        riscv_int_regnames_riscv32[tcg_ctx._4_4_]);
    tcg_ctx_00->cpu_gpr[tcg_ctx._4_4_] = pTVar1;
  }
  for (tcg_ctx._4_4_ = 0; tcg_ctx._4_4_ < 0x20; tcg_ctx._4_4_ = tcg_ctx._4_4_ + 1) {
    pTVar2 = tcg_global_mem_new_i64
                       (tcg_ctx_00,tcg_ctx_00->cpu_env,(long)tcg_ctx._4_4_ * 8 + 0x80,
                        riscv_fpr_regnames_riscv32[tcg_ctx._4_4_]);
    tcg_ctx_00->cpu_fpr[tcg_ctx._4_4_] = pTVar2;
  }
  pTVar1 = tcg_global_mem_new_i32(tcg_ctx_00,tcg_ctx_00->cpu_env,0x180,"pc");
  tcg_ctx_00->cpu_pc = pTVar1;
  pTVar1 = tcg_global_mem_new_i32(tcg_ctx_00,tcg_ctx_00->cpu_env,0x184,"load_res");
  tcg_ctx_00->load_res = pTVar1;
  pTVar1 = tcg_global_mem_new_i32(tcg_ctx_00,tcg_ctx_00->cpu_env,0x188,"load_val");
  tcg_ctx_00->load_val = pTVar1;
  return;
}

Assistant:

void riscv_translate_init(struct uc_struct *uc)
{
    int i;
    TCGContext *tcg_ctx = uc->tcg_ctx;

    /* cpu_gpr[0] is a placeholder for the zero register. Do not use it. */
    /* Use the gen_set_gpr and gen_get_gpr helper functions when accessing */
    /* registers, unless you specifically block reads/writes to reg 0 */
    tcg_ctx->cpu_gpr[0] = NULL;

    for (i = 1; i < 32; i++) {
        tcg_ctx->cpu_gpr[i] = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env,
            offsetof(CPURISCVState, gpr[i]), riscv_int_regnames[i]);
    }

    for (i = 0; i < 32; i++) {
        tcg_ctx->cpu_fpr[i] = tcg_global_mem_new_i64(tcg_ctx, tcg_ctx->cpu_env,
            offsetof(CPURISCVState, fpr[i]), riscv_fpr_regnames[i]);
    }

    tcg_ctx->cpu_pc = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPURISCVState, pc), "pc");
    tcg_ctx->load_res = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPURISCVState, load_res),
                             "load_res");
    tcg_ctx->load_val = tcg_global_mem_new(tcg_ctx, tcg_ctx->cpu_env, offsetof(CPURISCVState, load_val),
                             "load_val");
}